

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O0

SchemaResolution __thiscall avro::NodeUnion::resolve(NodeUnion *this,Node *reader)

{
  SchemaResolution SVar1;
  ulong uVar2;
  shared_ptr<avro::Node> *this_00;
  type pNVar3;
  undefined8 in_RSI;
  long *in_RDI;
  SchemaResolution thisMatch;
  NodePtr *node;
  size_t i;
  SchemaResolution match;
  ulong local_20;
  SchemaResolution local_14;
  
  local_14 = RESOLVE_NO_MATCH;
  local_20 = 0;
  while( true ) {
    uVar2 = (**(code **)(*in_RDI + 0x20))();
    if (uVar2 <= local_20) {
      return local_14;
    }
    this_00 = (shared_ptr<avro::Node> *)(**(code **)(*in_RDI + 0x28))(in_RDI,local_20 & 0xffffffff);
    pNVar3 = boost::shared_ptr<avro::Node>::operator->(this_00);
    SVar1 = (*pNVar3->_vptr_Node[0xc])(pNVar3,in_RSI);
    if (SVar1 == RESOLVE_MATCH) break;
    if (local_14 == RESOLVE_NO_MATCH) {
      local_14 = SVar1;
    }
    local_20 = local_20 + 1;
  }
  return RESOLVE_MATCH;
}

Assistant:

SchemaResolution
NodeUnion::resolve(const Node &reader) const 
{

    // If the writer is union, resolution only needs to occur when the selected
    // type of the writer is known, so this function is not very helpful.
    //
    // In this case, this function returns if there is a possible match given
    // any writer type, so just search type by type returning the best match
    // found.
    
    SchemaResolution match = RESOLVE_NO_MATCH;
    for(size_t i=0; i < leaves(); ++i) {
        const NodePtr &node = leafAt(i);
        SchemaResolution thisMatch = node->resolve(reader);
        if(thisMatch == RESOLVE_MATCH) {
            match = thisMatch;
            break;
        }
        if(match == RESOLVE_NO_MATCH) {
            match = thisMatch;
        }
    }
    return match;
}